

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fuzz.c
# Opt level: O2

void test_fuzz(files *filesets)

{
  size_t sVar1;
  FILE *pFVar2;
  int iVar3;
  wchar_t wVar4;
  int iVar5;
  archive *paVar6;
  char *pcVar7;
  void *pvVar8;
  time_t tVar9;
  FILE *__s;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  files *pfVar13;
  size_t size;
  files *local_90;
  void *local_88;
  long local_80;
  files *local_78;
  ulong local_70;
  FILE *local_68;
  size_t local_60;
  size_t local_58;
  archive_entry *ae;
  int64_t blk_offset;
  size_t blk_size;
  void *blk;
  
  local_80 = 0;
  local_90 = filesets;
  do {
    if (filesets[local_80].names == (char **)0x0) {
      return;
    }
    pfVar13 = filesets + local_80;
    size = 0;
    extract_reference_files(filesets[local_80].names);
    if (pfVar13->uncompress == 0) {
      sVar10 = 0;
      local_88 = (void *)0x0;
      uVar11 = 0;
      local_78 = pfVar13;
      while (pcVar7 = *(char **)((long)local_78->names + uVar11), filesets = local_90,
            pcVar7 != (char *)0x0) {
        local_70 = uVar11;
        pcVar7 = slurpfile(&size,pcVar7);
        local_58 = size;
        local_60 = size + sVar10;
        pvVar8 = realloc(local_88,local_60);
        memcpy((void *)(sVar10 + (long)pvVar8),pcVar7,local_58);
        sVar10 = local_60;
        size = local_60;
        free(pcVar7);
        local_88 = pvVar8;
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                         ,L'v',(uint)(pvVar8 != (void *)0x0),"rawimage != NULL",(void *)0x0);
        uVar11 = local_70 + 8;
      }
LAB_001414bf:
      lVar12 = local_80;
      if (size != 0) {
        pvVar8 = malloc(size);
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                         ,L'}',(uint)(pvVar8 != (void *)0x0),"image != NULL",(void *)0x0);
        if (pvVar8 == (void *)0x0) {
          return;
        }
        tVar9 = time((time_t *)0x0);
        srand((uint)tVar9);
        uVar11 = 0;
        while (sVar1 = size, (int)uVar11 != 100) {
          local_70 = uVar11;
          memcpy(pvVar8,local_88,size);
          iVar3 = (int)sVar1;
          iVar5 = (int)((long)((ulong)(uint)(iVar3 >> 0x1f) << 0x20 | sVar1 & 0xffffffff) / 100);
          if (iVar3 + 99U < 199) {
            iVar5 = 1;
          }
          iVar3 = rand();
          uVar11 = (long)iVar3 % (long)iVar5 & 0xffffffff;
          if ((int)((long)iVar3 % (long)iVar5) < 1) {
            uVar11 = 0;
          }
          while (iVar3 = (int)uVar11, uVar11 = (ulong)(iVar3 - 1), iVar3 != 0) {
            iVar3 = rand();
            iVar5 = rand();
            *(char *)((long)pvVar8 + (ulong)(long)iVar5 % size) = (char)iVar3;
          }
          iVar3 = 4;
          pFVar2 = local_68;
          do {
            __s = pFVar2;
            iVar3 = iVar3 + -1;
            if (iVar3 == 0) break;
            __s = fopen("after.test.failure.send.this.file.to.libarchive.maintainers.with.system.details"
                        ,"wb");
            pFVar2 = (FILE *)0x0;
          } while (__s == (FILE *)0x0);
          sVar1 = size;
          sVar10 = fwrite(pvVar8,1,size,__s);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                              ,L'\x9e',sVar1,"(size_t)size",sVar10,
                              "fwrite(image, 1, (size_t)size, f)",(void *)0x0);
          local_68 = __s;
          fclose(__s);
          paVar6 = archive_read_new();
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                           ,L'¡',(uint)(paVar6 != (archive *)0x0),
                           "(a = archive_read_new()) != NULL",(void *)0x0);
          iVar3 = archive_read_support_filter_all(paVar6);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                              ,L'£',0,"ARCHIVE_OK",(long)iVar3,"archive_read_support_filter_all(a)"
                              ,paVar6);
          iVar3 = archive_read_support_format_all(paVar6);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                              ,L'¥',0,"ARCHIVE_OK",(long)iVar3,"archive_read_support_format_all(a)"
                              ,paVar6);
          iVar3 = archive_read_open_memory(paVar6,pvVar8,size);
          if (iVar3 == 0) {
            while (iVar3 = archive_read_next_header(paVar6,&ae), iVar3 == 0) {
              do {
                iVar3 = archive_read_data_block(paVar6,&blk,&blk_size,&blk_offset);
              } while (iVar3 == 0);
            }
            archive_read_close(paVar6);
          }
          archive_read_free(paVar6);
          uVar11 = (ulong)((int)local_70 + 1);
        }
        free(pvVar8);
        free(local_88);
        lVar12 = local_80;
        filesets = local_90;
      }
    }
    else {
      paVar6 = archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                       ,L'J',(uint)(paVar6 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                       (void *)0x0);
      iVar3 = archive_read_support_filter_all(paVar6);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                          ,L'L',0,"ARCHIVE_OK",(long)iVar3,"archive_read_support_filter_all(a)",
                          paVar6);
      iVar3 = archive_read_support_format_raw(paVar6);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                          ,L'N',0,"ARCHIVE_OK",(long)iVar3,"archive_read_support_format_raw(a)",
                          paVar6);
      wVar4 = archive_read_open_filenames(paVar6,pfVar13->names,0x4000);
      if (wVar4 == L'\0') {
        local_78 = pfVar13;
        iVar3 = archive_read_next_header(paVar6,&ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                            ,L'Z',0,"ARCHIVE_OK",(long)iVar3,"archive_read_next_header(a, &ae)",
                            paVar6);
        local_88 = malloc(30000000);
        size = archive_read_data(paVar6,local_88,30000000);
        iVar3 = archive_read_next_header(paVar6,&ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                            ,L'^',1,"ARCHIVE_EOF",(long)iVar3,"archive_read_next_header(a, &ae)",
                            paVar6);
        iVar3 = archive_read_free(paVar6);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                            ,L'`',0,"ARCHIVE_OK",(long)iVar3,"archive_read_free(a)",(void *)0x0);
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                         ,L'a',(uint)(size != 0),"size > 0",(void *)0x0);
        if ((*local_78->names == (char *)0x0) || (local_78->names[1] == (char *)0x0)) {
          failure("Internal buffer is not big enough for uncompressed test files");
        }
        else {
          failure("Internal buffer is not big enough for uncompressed test file: %s");
        }
        filesets = local_90;
        wVar4 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                                 ,L'i',(uint)(size < buff3 + 0x5de810),"size < buffsize",(void *)0x0
                                );
        if (wVar4 != L'\0') goto LAB_001414bf;
        free(local_88);
        lVar12 = local_80;
      }
      else {
        archive_read_free(paVar6);
        lVar12 = local_80;
        if ((*pfVar13->names == (char *)0x0) || (pfVar13->names[1] == (char *)0x0)) {
          skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                         ,L'S');
          test_skipping("Cannot uncompress fileset");
          filesets = local_90;
        }
        else {
          skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                         ,L'U');
          test_skipping("Cannot uncompress %s",*pfVar13->names);
          filesets = local_90;
        }
      }
    }
    local_80 = lVar12 + 1;
  } while( true );
}

Assistant:

static void
test_fuzz(const struct files *filesets)
{
	const void *blk;
	size_t blk_size;
	int64_t blk_offset;
	int n;

	for (n = 0; filesets[n].names != NULL; ++n) {
		const size_t buffsize = 30000000;
		struct archive_entry *ae;
		struct archive *a;
		char *rawimage = NULL, *image = NULL, *tmp = NULL;
		size_t size = 0, oldsize = 0;
		int i, q;

		extract_reference_files(filesets[n].names);
		if (filesets[n].uncompress) {
			int r;
			/* Use format_raw to decompress the data. */
			assert((a = archive_read_new()) != NULL);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_filter_all(a));
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_format_raw(a));
			r = archive_read_open_filenames(a, filesets[n].names, 16384);
			if (r != ARCHIVE_OK) {
				archive_read_free(a);
				if (filesets[n].names[0] == NULL || filesets[n].names[1] == NULL) {
					skipping("Cannot uncompress fileset");
				} else {
					skipping("Cannot uncompress %s", filesets[n].names[0]);
				}
				continue;
			}
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_next_header(a, &ae));
			rawimage = malloc(buffsize);
			size = archive_read_data(a, rawimage, buffsize);
			assertEqualIntA(a, ARCHIVE_EOF,
			    archive_read_next_header(a, &ae));
			assertEqualInt(ARCHIVE_OK,
			    archive_read_free(a));
			assert(size > 0);
			if (filesets[n].names[0] == NULL || filesets[n].names[1] == NULL) {
				failure("Internal buffer is not big enough for "
					"uncompressed test files");
			} else {
				failure("Internal buffer is not big enough for "
					"uncompressed test file: %s", filesets[n].names[0]);
			}
			if (!assert(size < buffsize)) {
				free(rawimage);
				continue;
			}
		} else {
			for (i = 0; filesets[n].names[i] != NULL; ++i)
			{
				tmp = slurpfile(&size, filesets[n].names[i]);
				rawimage = (char *)realloc(rawimage, oldsize + size);
				memcpy(rawimage + oldsize, tmp, size);
				oldsize += size;
				size = oldsize;
				free(tmp);
				if (!assert(rawimage != NULL))
					continue;
			}
		}
		if (size == 0)
			continue;
		image = malloc(size);
		assert(image != NULL);
		if (image == NULL)
			return;
		srand((unsigned)time(NULL));

		for (i = 0; i < 100; ++i) {
			FILE *f;
			int j, numbytes, trycnt;

			/* Fuzz < 1% of the bytes in the archive. */
			memcpy(image, rawimage, size);
			q = (int)size / 100;
			if (!q) q = 1;
			numbytes = (int)(rand() % q);
			for (j = 0; j < numbytes; ++j)
				image[rand() % size] = (char)rand();

			/* Save the messed-up image to a file.
			 * If we crash, that file will be useful. */
			for (trycnt = 0; trycnt < 3; trycnt++) {
				f = fopen("after.test.failure.send.this.file."
				    "to.libarchive.maintainers.with.system.details", "wb");
				if (f != NULL)
					break;
#if defined(_WIN32) && !defined(__CYGWIN__)
				/*
				 * Sometimes previous close operation does not completely
				 * end at this time. So we should take a wait while
				 * the operation running.
				 */
				Sleep(100);
#endif
			}
			assertEqualInt((size_t)size, fwrite(image, 1, (size_t)size, f));
			fclose(f);

			assert((a = archive_read_new()) != NULL);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_filter_all(a));
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_format_all(a));

			if (0 == archive_read_open_memory(a, image, size)) {
				while(0 == archive_read_next_header(a, &ae)) {
					while (0 == archive_read_data_block(a,
						&blk, &blk_size, &blk_offset))
						continue;
				}
				archive_read_close(a);
			}
			archive_read_free(a);
		}
		free(image);
		free(rawimage);
	}
}